

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmm.c
# Opt level: O1

int stmm_foreach(stmm_table *table,_func_stmm_retval_char_ptr_char_ptr_char_ptr *func,char *arg)

{
  stmm_retval sVar1;
  stmm_table_entry **ppsVar2;
  long lVar3;
  stmm_table_entry *pEntry;
  
  if (0 < table->num_bins) {
    lVar3 = 0;
    do {
      pEntry = table->bins[lVar3];
      if (pEntry != (stmm_table_entry *)0x0) {
        ppsVar2 = table->bins + lVar3;
        do {
          sVar1 = (*func)(pEntry->key,pEntry->record,arg);
          if (sVar1 == STMM_CONTINUE) {
            ppsVar2 = &pEntry->next;
LAB_0040f591:
            pEntry = *ppsVar2;
          }
          else {
            if (sVar1 == STMM_DELETE) {
              *ppsVar2 = pEntry->next;
              table->num_entries = table->num_entries + -1;
              Extra_MmFixedEntryRecycle((Extra_MmFixed_t *)table->pMemMan,(char *)pEntry);
              goto LAB_0040f591;
            }
            if (sVar1 == STMM_STOP) {
              return 0;
            }
          }
        } while (pEntry != (stmm_table_entry *)0x0);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < table->num_bins);
  }
  return 1;
}

Assistant:

int
stmm_foreach (stmm_table *table, enum stmm_retval (*func) (char *, char *, char *), char *arg)
{
    stmm_table_entry *ptr, **last;
    enum stmm_retval retval;
    int i;

    for (i = 0; i < table->num_bins; i++) {
    last = &table->bins[i];
    ptr = *last;
    while (ptr != NULL) {
        retval = (*func) (ptr->key, ptr->record, arg);
        switch (retval) {
        case STMM_CONTINUE:
        last = &ptr->next;
        ptr = *last;
        break;
        case STMM_STOP:
        return 0;
        case STMM_DELETE:
        *last = ptr->next;
        table->num_entries--;   /* cstevens@ic */
//                              ABC_FREE( ptr );
        Extra_MmFixedEntryRecycle ((Extra_MmFixed_t *)table->pMemMan, (char *) ptr);

        ptr = *last;
        }
    }
    }
    return 1;
}